

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O0

void __thiscall
mocker::Token::Val<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Val(Val<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  Val<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  ~Val(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~Val() override = default;